

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

int getDWPTNodelength(wpt_object wt,int X)

{
  if ((0 < X) && (X <= wt->J)) {
    return wt->length[(long)(wt->J - X) + 1];
  }
  printf("X co-ordinate must be >= 1 and <= %d");
  exit(-1);
}

Assistant:

int getDWPTNodelength(wpt_object wt, int X) {
	int N;
	N = -1;
	/*
	X - Level. All Nodes at any level have the same length
	*/
	if (X <= 0 || X > wt->J) {
		printf("X co-ordinate must be >= 1 and <= %d", wt->J);
		exit(-1);
	}

	N = wt->length[wt->J - X + 1];

	return N;
}